

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3WriteSegment(Fts3Table *p,sqlite3_int64 iBlock,char *z,int n)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  int iVar3;
  Vdbe *p_1;
  sqlite3_stmt *pStmt;
  Vdbe *local_30;
  
  iVar2 = fts3SqlStmt(p,9,(sqlite3_stmt **)&local_30,(sqlite3_value **)0x0);
  if (iVar2 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)local_30,1,iBlock);
    bindText((sqlite3_stmt *)local_30,2,z,n,(_func_void_void_ptr *)0x0,'\0');
    sqlite3_step((sqlite3_stmt *)local_30);
    iVar2 = sqlite3_reset((sqlite3_stmt *)local_30);
    iVar3 = vdbeUnbind(local_30,2);
    if ((iVar3 == 0) && (psVar1 = local_30->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
  }
  return iVar2;
}

Assistant:

static int fts3WriteSegment(
  Fts3Table *p,                   /* Virtual table handle */
  sqlite3_int64 iBlock,           /* Block id for new block */
  char *z,                        /* Pointer to buffer containing block data */
  int n                           /* Size of buffer z in bytes */
){
  sqlite3_stmt *pStmt;
  int rc = fts3SqlStmt(p, SQL_INSERT_SEGMENTS, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pStmt, 1, iBlock);
    sqlite3_bind_blob(pStmt, 2, z, n, SQLITE_STATIC);
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt, 2);
  }
  return rc;
}